

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys.cpp
# Opt level: O0

int __thiscall
jbcoin::ValidatorKeys::sign
          (ValidatorKeys *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  Slice local_50;
  Buffer local_40;
  Slice local_30;
  uchar *local_20;
  string *data_local;
  ValidatorKeys *this_local;
  
  local_20 = sig;
  data_local = (string *)ctx;
  this_local = this;
  local_50 = makeSlice<std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sig);
  jbcoin::sign((jbcoin *)&local_40,(PublicKey *)(ctx + 8),(SecretKey *)(ctx + 0x38),&local_50);
  local_30 = Buffer::operator_cast_to_Slice(&local_40);
  strHex_abi_cxx11_((string *)this,(jbcoin *)&local_30,(Slice *)local_30.size_);
  Buffer::~Buffer(&local_40);
  return (int)this;
}

Assistant:

std::string
ValidatorKeys::sign (std::string const& data)
{
    return strHex(jbcoin::sign (publicKey_, secretKey_, makeSlice (data)));
}